

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  time_point<std::filesystem::__file_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *ptVar3;
  istream *piVar4;
  size_type sVar5;
  undefined8 uVar6;
  reference this;
  reference compiledShaderName;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<BlobEntry,_std::allocator<BlobEntry>_>_>
  *it;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<BlobEntry,_std::allocator<BlobEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<BlobEntry,_std::allocator<BlobEntry>_>_>_>_>
  *__range1_1;
  uint threadIndex_1;
  uint local_324;
  undefined1 local_320 [4];
  uint threadIndex;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  uint threadCount;
  string line;
  istream local_2d8 [4];
  uint32_t lineno;
  ifstream configFile;
  path local_d0;
  time_point<std::filesystem::__file_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_a8;
  path local_a0;
  rep local_78;
  path local_60;
  reference local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fileName;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  bVar1 = CommandLineOptions::parse(&g_Options,argc,argv);
  if (bVar1) {
    switch(g_Options.platform) {
    case UNKNOWN:
      std::__cxx11::string::operator=((string *)&g_PlatformName_abi_cxx11_,"UNKNOWN");
      break;
    case DXBC:
      std::__cxx11::string::operator=((string *)&g_PlatformName_abi_cxx11_,"DXBC");
      break;
    case DXIL:
      std::__cxx11::string::operator=((string *)&g_PlatformName_abi_cxx11_,"DXIL");
      break;
    case SPIRV:
      std::__cxx11::string::operator=((string *)&g_PlatformName_abi_cxx11_,"SPIR-V");
    }
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&g_Options.ignoreFileNames);
    fileName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&g_Options.ignoreFileNames);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&fileName), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_60,local_38,auto_format);
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      push_back(&g_IgnoreIncludes_abi_cxx11_,&local_60);
      std::filesystem::__cxx11::path::~path(&local_60);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_a0,&g_Options.inputFile,auto_format);
    g_ConfigWriteTime.__d.__r = (duration)std::filesystem::last_write_time(&local_a0);
    local_78 = (rep)g_ConfigWriteTime.__d.__r;
    std::filesystem::__cxx11::path::~path(&local_a0);
    std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
              (&local_d0,argv,auto_format);
    local_a8.__d.__r = (duration)std::filesystem::last_write_time(&local_d0);
    ptVar3 = std::
             max<std::chrono::time_point<std::filesystem::__file_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                       (&g_ConfigWriteTime,&local_a8);
    g_ConfigWriteTime.__d.__r = (duration)(ptVar3->__d).__r;
    std::filesystem::__cxx11::path::~path(&local_d0);
    std::ifstream::ifstream(local_2d8,(string *)&g_Options,_S_in);
    line.field_2._12_4_ = 0;
    std::__cxx11::string::string((string *)&threadCount);
    do {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_2d8,(string *)&threadCount);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar1) {
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
        goto LAB_0010dc9d;
      }
      line.field_2._12_4_ = line.field_2._12_4_ + 1;
      bVar1 = trim((string *)&threadCount);
    } while ((!bVar1) ||
            (bVar1 = expandPermutations(line.field_2._12_4_,(string *)&threadCount), bVar1));
    argv_local._4_4_ = 1;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
LAB_0010dc9d:
    std::__cxx11::string::~string((string *)&threadCount);
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 5) {
      bVar1 = std::vector<CompileTask,_std::allocator<CompileTask>_>::empty(&g_CompileTasks);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"All ");
        poVar2 = std::operator<<(poVar2,(string *)&g_PlatformName_abi_cxx11_);
        poVar2 = std::operator<<(poVar2," outputs are up to date.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 0;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
      else {
        sVar5 = std::vector<CompileTask,_std::allocator<CompileTask>_>::size(&g_CompileTasks);
        g_OriginalTaskCount = (int)sVar5;
        std::__atomic_base<int>::operator=(&g_ProcessedTaskCount.super___atomic_base<int>,0);
        uVar6 = std::__cxx11::string::c_str();
        snprintf(main::envBuf,0x400,"COMPILER=%s",uVar6);
        putenv(main::envBuf);
        if ((g_Options.verbose & 1U) != 0) {
          poVar2 = std::operator<<((ostream *)&std::cout,main::envBuf);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = std::thread::hardware_concurrency();
        if (((uint)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage == 0) ||
           ((g_Options.parallel & 1U) == 0)) {
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        signal(2,signal_handler);
        std::vector<std::thread,_std::allocator<std::thread>_>::vector
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_320);
        std::vector<std::thread,_std::allocator<std::thread>_>::resize
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_320,
                   (ulong)(uint)threads.
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        for (local_324 = 0;
            local_324 <
            (uint)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage; local_324 = local_324 + 1) {
          std::thread::thread<void(&)(),,void>((thread *)&stack0xfffffffffffffcd0,compileThreadProc)
          ;
          this = std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                           ((vector<std::thread,_std::allocator<std::thread>_> *)local_320,
                            (ulong)local_324);
          std::thread::operator=(this,(thread *)&stack0xfffffffffffffcd0);
          std::thread::~thread((thread *)&stack0xfffffffffffffcd0);
        }
        for (__range1_1._4_4_ = 0;
            __range1_1._4_4_ <
            (uint)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage; __range1_1._4_4_ = __range1_1._4_4_ + 1
            ) {
          std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                    ((vector<std::thread,_std::allocator<std::thread>_> *)local_320,
                     (ulong)__range1_1._4_4_);
          std::thread::join();
        }
        if (((g_CompileSuccess & 1U) == 0) || ((g_Terminate & 1U) != 0)) {
          argv_local._4_4_ = 1;
        }
        else {
          __end1_1 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<BlobEntry,_std::allocator<BlobEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<BlobEntry,_std::allocator<BlobEntry>_>_>_>_>
                     ::begin(&g_ShaderBlobs_abi_cxx11_);
          it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<BlobEntry,_std::allocator<BlobEntry>_>_>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<BlobEntry,_std::allocator<BlobEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<BlobEntry,_std::allocator<BlobEntry>_>_>_>_>
                  ::end(&g_ShaderBlobs_abi_cxx11_);
          while (bVar1 = std::operator!=(&__end1_1,(_Self *)&it), bVar1) {
            compiledShaderName =
                 std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<BlobEntry,_std::allocator<BlobEntry>_>_>_>
                 ::operator*(&__end1_1);
            bVar1 = WriteShaderBlob(&compiledShaderName->first,&compiledShaderName->second);
            if (!bVar1) {
              argv_local._4_4_ = 1;
              goto LAB_0010e00e;
            }
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<BlobEntry,_std::allocator<BlobEntry>_>_>_>
            ::operator++(&__end1_1);
          }
          argv_local._4_4_ = 0;
        }
LAB_0010e00e:
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_320);
      }
    }
    std::ifstream::~ifstream(local_2d8);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&g_Options.errorMessage);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
	if (!g_Options.parse(argc, argv))
	{
		cout << g_Options.errorMessage << endl;
		return 1;
	}

	switch (g_Options.platform)
	{
	case Platform::DXBC: g_PlatformName = "DXBC"; break;
	case Platform::DXIL: g_PlatformName = "DXIL"; break;
	case Platform::SPIRV: g_PlatformName = "SPIR-V"; break;
	case Platform::UNKNOWN: g_PlatformName = "UNKNOWN"; break; // never happens
	}

	for (const auto& fileName : g_Options.ignoreFileNames)
	{
		g_IgnoreIncludes.push_back(fileName);
	}
	
	g_ConfigWriteTime = fs::last_write_time(g_Options.inputFile);

	// Updated shaderCompiler executable also means everything must be recompiled
	g_ConfigWriteTime = std::max(g_ConfigWriteTime, fs::last_write_time(argv[0]));
	
	ifstream configFile(g_Options.inputFile);
	uint32_t lineno = 0;
	for(string line; getline(configFile, line);)
	{
		lineno++;

		if (!trim(line))
			continue;

		if (!expandPermutations(lineno, line))
			return 1;
	}

	if (g_CompileTasks.empty())
	{
		cout << "All " << g_PlatformName << " outputs are up to date." << endl;
		return 0;
	}

	g_OriginalTaskCount = (int)g_CompileTasks.size();
	g_ProcessedTaskCount = 0;

	{
		// Workaround for weird behavior of _popen / cmd.exe on Windows
		// with quotes around the executable name and also around some other arguments.

		static char envBuf[1024]; // use a static array because putenv uses it by reference
#ifdef WIN32
		snprintf(envBuf, sizeof(envBuf), "COMPILER=\"%s\"", g_Options.compilerPath.c_str());
#else
		snprintf(envBuf, sizeof(envBuf), "COMPILER=%s", g_Options.compilerPath.c_str());
#endif
		putenv(envBuf);
		
		if (g_Options.verbose)
		{
			cout << envBuf << endl;
		}
	}

	unsigned int threadCount = thread::hardware_concurrency();
	if (threadCount == 0 || !g_Options.parallel)
	{
		threadCount = 1;
	}

	signal(SIGINT, signal_handler);

	vector<thread> threads;
	threads.resize(threadCount);
	for (unsigned int threadIndex = 0; threadIndex < threadCount; threadIndex++)
	{
		threads[threadIndex] = thread(compileThreadProc);
	}
	for (unsigned int threadIndex = 0; threadIndex < threadCount; threadIndex++)
	{
		threads[threadIndex].join();
	}

	if (!g_CompileSuccess || g_Terminate)
		return 1;

	for (const pair<const string, vector<BlobEntry>>& it : g_ShaderBlobs)
	{
		if (!WriteShaderBlob(it.first, it.second))
			return 1;
	}

	return 0;
}